

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_session.hpp
# Opt level: O2

string * binlog::detail::this_thread_id_string_abi_cxx11_(void)

{
  id __id;
  string *in_RDI;
  ostringstream str;
  ostringstream aoStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  __id._M_thread = pthread_self();
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)aoStack_188,__id);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  return in_RDI;
}

Assistant:

inline std::string this_thread_id_string()
{
  std::ostringstream str;
  str << std::this_thread::get_id();
  return str.str();
}